

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O2

void square_set_door_lock(chunk *c,loc grid,wchar_t power)

{
  _Bool _Var1;
  trap_kind *ptVar2;
  trap *ptVar3;
  
  ptVar2 = (trap_kind *)lookup_trap("door lock");
  _Var1 = square_iscloseddoor((chunk_conflict *)c,grid);
  if (_Var1) {
    _Var1 = square_trap_specific(c,grid,ptVar2->tidx);
    if (!_Var1) {
      place_trap(c,grid,ptVar2->tidx,L'\0');
    }
    for (ptVar3 = square_trap((chunk_conflict *)c,grid); ptVar3 != (trap *)0x0;
        ptVar3 = ptVar3->next) {
      if (ptVar3->kind == ptVar2) {
        ptVar3->power = (uint8_t)power;
      }
    }
  }
  return;
}

Assistant:

void square_set_door_lock(struct chunk *c, struct loc grid, int power)
{
	struct trap_kind *lock = lookup_trap("door lock");
	struct trap *trap;

	/* Verify it's a closed door */
	if (!square_iscloseddoor(c, grid))
		return;

	/* If there's no lock there, add one */
	if (!square_trap_specific(c, grid, lock->tidx))
		place_trap(c, grid, lock->tidx, 0);

	/* Set the power (of all locks - there should be only one) */
	trap = square_trap(c, grid);
	while (trap) {
		if (trap->kind == lock)
			trap->power = power;
		trap = trap->next;
	}
}